

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::ReshapeLayerParams::_internal_add_targetshape
          (ReshapeLayerParams *this,int64_t value)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long tmp;
  
  this_00 = &this->targetshape_;
  uVar1 = (this->targetshape_).current_size_;
  uVar2 = (this->targetshape_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this_00,uVar2 + 1);
  }
  plVar3 = google::protobuf::RepeatedField<long>::elements(this_00);
  plVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void ReshapeLayerParams::_internal_add_targetshape(int64_t value) {
  targetshape_.Add(value);
}